

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrunnable.h
# Opt level: O1

void * QRunnable::QGenericRunnable::
       Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qdrawhelper.cpp:4145:5)>
       ::impl(Op op,HelperBase *that,void *arg)

{
  if (op == Destroy) {
    if (that != (HelperBase *)0x0) {
      operator_delete(that,0x20);
    }
  }
  else if (op == Run) {
    blend_color_generic_fp::anon_class_48_6_31ab0bab::operator()
              ((anon_class_48_6_31ab0bab *)that[2].fn,*(int *)&that[1].fn,
               *(int *)((long)&that[1].fn + 4) + *(int *)&that[1].fn);
    QSemaphore::release((int)that[3].fn);
  }
  return (void *)0x0;
}

Assistant:

static void *impl(Op op, HelperBase *that, [[maybe_unused]] void *arg)
        {
            const auto _this = static_cast<Helper*>(that);
            switch (op) {
            case Op::Run:     _this->object()(); break;
            case Op::Destroy: delete _this; break;
            }
            return nullptr;
        }